

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

String * __thiscall
capnp::JsonCodec::encode<capnp::DynamicStruct::Reader>
          (String *__return_storage_ptr__,JsonCodec *this,Reader *value)

{
  Type type;
  Reader local_50;
  
  local_50.field_1._48_8_ = *(undefined8 *)&(value->reader).nestingLimit;
  local_50.field_1.intValue = (int64_t)(value->schema).super_Schema.raw;
  local_50.field_1.textValue.super_StringPtr.content.size_ = (size_t)(value->reader).segment;
  local_50.field_1.listValue.reader.segment = (SegmentReader *)(value->reader).capTable;
  local_50.field_1.listValue.reader.capTable = (CapTableReader *)(value->reader).data;
  local_50.field_1.listValue.reader.ptr = (byte *)(value->reader).pointers;
  local_50.field_1._40_4_ = (value->reader).dataSize;
  local_50.field_1._44_2_ = (value->reader).pointerCount;
  local_50.field_1._46_2_ = *(undefined2 *)&(value->reader).field_0x26;
  local_50.type = STRUCT;
  type.field_4.schema = (value->schema).super_Schema.raw;
  type.baseType = STRUCT;
  type.listDepth = '\0';
  type.isImplicitParam = false;
  type.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  type._6_2_ = 0;
  encode(__return_storage_ptr__,this,&local_50,type);
  DynamicValue::Reader::~Reader(&local_50);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encode(T&& value) const {
  Type type = Type::from(value);
  typedef FromAny<kj::Decay<T>> Base;
  return encode(DynamicValue::Reader(ReaderFor<Base>(kj::fwd<T>(value))), type);
}